

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O2

_Bool oonf_packet_managed_is_active(oonf_packet_managed *managed,int af_type)

{
  long lVar1;
  
  if (af_type == 10) {
    lVar1 = 0x308;
    if ((managed->socket_v6).node.next == (list_entity *)0x0) {
      return false;
    }
  }
  else {
    if ((af_type != 2) || ((managed->socket_v4).node.next == (list_entity *)0x0)) {
      return false;
    }
    lVar1 = 8;
  }
  return *(long *)((long)&(managed->socket_v4).node.next + lVar1) != 0;
}

Assistant:

bool
oonf_packet_managed_is_active(struct oonf_packet_managed *managed, int af_type) {
  switch (af_type) {
    case AF_INET:
      return oonf_packet_is_active(&managed->socket_v4);
    case AF_INET6:
      return oonf_packet_is_active(&managed->socket_v6);
    default:
      return false;
  }
}